

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HessenbergDecomposition.h
# Opt level: O0

void Eigen::HessenbergDecomposition<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::_compute
               (MatrixType *matA,CoeffVectorType *hCoeffs,VectorType *temp)

{
  PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *this;
  PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *pPVar1;
  Index IVar2;
  ScalarWithConstIfNotLvalue *pSVar3;
  Scalar *pSVar4;
  Scalar *in_stack_000000b8;
  Scalar *in_stack_000000c0;
  Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>
  *in_stack_000000c8;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>_> *in_stack_000000d0;
  Scalar *in_stack_00000118;
  Scalar *in_stack_00000120;
  VectorBlock<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1> *in_stack_00000128
  ;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>_> *in_stack_00000130;
  Scalar h;
  RealScalar beta;
  Index remainingSize;
  Index i;
  Index n;
  ScalarWithConstIfNotLvalue index;
  PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *in_stack_fffffffffffffe10;
  DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *in_stack_fffffffffffffe18;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>_>
  *in_stack_fffffffffffffe28;
  Index in_stack_fffffffffffffe30;
  DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *in_stack_fffffffffffffe38;
  DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *in_stack_fffffffffffffe40;
  RealScalar *in_stack_fffffffffffffe70;
  Scalar *in_stack_fffffffffffffe78;
  MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
  *in_stack_fffffffffffffe80;
  PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *local_40;
  ScalarWithConstIfNotLvalue local_38;
  long local_28;
  
  this = (PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)
         PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::rows
                   ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)0x2e644c);
  pPVar1 = (PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)
           PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::cols
                     ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)0x2e645e);
  if (this == pPVar1) {
    IVar2 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::rows
                      ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)0x2e6499);
    PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::resize
              (this,(Index)in_stack_fffffffffffffe18);
    for (local_28 = 0; local_28 < IVar2 + -1; local_28 = local_28 + 1) {
      DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::col
                (in_stack_fffffffffffffe18,(Index)in_stack_fffffffffffffe10);
      DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>_>::tail
                (in_stack_fffffffffffffe28,(Index)this);
      MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>_>
      ::makeHouseholderInPlace
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      index = local_38;
      DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::col
                (in_stack_fffffffffffffe18,(Index)in_stack_fffffffffffffe10);
      pSVar3 = MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_1>::coeffRef
                         ((MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_1>
                           *)this,(Index)in_stack_fffffffffffffe18);
      *pSVar3 = index;
      in_stack_fffffffffffffe10 = local_40;
      pSVar4 = PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::coeffRef
                         ((PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)local_40,
                          (Index)index);
      *pSVar4 = (Scalar)in_stack_fffffffffffffe10;
      DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::bottomRightCorner
                (in_stack_fffffffffffffe40,(Index)in_stack_fffffffffffffe38,
                 in_stack_fffffffffffffe30);
      DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::col
                (in_stack_fffffffffffffe18,(Index)in_stack_fffffffffffffe10);
      DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>_>::tail
                (in_stack_fffffffffffffe28,(Index)this);
      PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::coeffRef
                (in_stack_fffffffffffffe10,(Index)index);
      MatrixBase<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,-1,-1,false>>::
      applyHouseholderOnTheLeft<Eigen::VectorBlock<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1>>
                (in_stack_00000130,in_stack_00000128,in_stack_00000120,in_stack_00000118);
      DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::rightCols
                (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::col
                (in_stack_fffffffffffffe18,(Index)in_stack_fffffffffffffe10);
      DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>_>::tail
                (in_stack_fffffffffffffe28,(Index)this);
      in_stack_fffffffffffffe18 =
           (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
           MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>_>
           ::conjugate((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
                        *)0x2e66bd);
      in_stack_fffffffffffffe28 =
           (DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>_> *)
           numext::conj<double>((double *)0x2e66cf);
      PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::coeffRef
                (in_stack_fffffffffffffe10,(Index)index);
      MatrixBase<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,-1,true>>::
      applyHouseholderOnTheRight<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1,1,false>>
                (in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
    }
    return;
  }
  __assert_fail("matA.rows()==matA.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Eigenvalues/./HessenbergDecomposition.h"
                ,0x126,
                "static void Eigen::HessenbergDecomposition<Eigen::Matrix<double, 2, 2>>::_compute(MatrixType &, CoeffVectorType &, VectorType &) [_MatrixType = Eigen::Matrix<double, 2, 2>]"
               );
}

Assistant:

void HessenbergDecomposition<MatrixType>::_compute(MatrixType& matA, CoeffVectorType& hCoeffs, VectorType& temp)
{
  eigen_assert(matA.rows()==matA.cols());
  Index n = matA.rows();
  temp.resize(n);
  for (Index i = 0; i<n-1; ++i)
  {
    // let's consider the vector v = i-th column starting at position i+1
    Index remainingSize = n-i-1;
    RealScalar beta;
    Scalar h;
    matA.col(i).tail(remainingSize).makeHouseholderInPlace(h, beta);
    matA.col(i).coeffRef(i+1) = beta;
    hCoeffs.coeffRef(i) = h;

    // Apply similarity transformation to remaining columns,
    // i.e., compute A = H A H'

    // A = H A
    matA.bottomRightCorner(remainingSize, remainingSize)
        .applyHouseholderOnTheLeft(matA.col(i).tail(remainingSize-1), h, &temp.coeffRef(0));

    // A = A H'
    matA.rightCols(remainingSize)
        .applyHouseholderOnTheRight(matA.col(i).tail(remainingSize-1).conjugate(), numext::conj(h), &temp.coeffRef(0));
  }
}